

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas_drawing.h
# Opt level: O2

void dlib::draw_line(canvas *c,point *p1,point *p2)

{
  int local_24;
  rectangle local_20;
  
  local_24 = 0;
  local_20.l = -0x8000000000000000;
  local_20.t = -0x8000000000000000;
  local_20.r = 0x7fffffffffffffff;
  local_20.b = 0x7fffffffffffffff;
  draw_line<int>(c,p1,p2,&local_24,&local_20);
  return;
}

Assistant:

inline void draw_line (
        const canvas& c,
        const point& p1,
        const point& p2
    ){ draw_line(c,p1,p2,0); }